

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uInput.cpp
# Opt level: O0

void __thiscall
uInputPlus::uInput::send_pos_absolute
          (uInput *this,uInputCoordinate *pos,int32_t mt_slot,bool report)

{
  bool report_local;
  int32_t mt_slot_local;
  uInputCoordinate *pos_local;
  uInput *this_local;
  
  if (mt_slot == -1) {
    if (pos->X != 0) {
      emit(this,3,0,pos->X);
    }
    if (pos->Y != 0) {
      emit(this,3,1,pos->Y);
    }
    if (pos->Z != 0) {
      emit(this,3,2,pos->Z);
    }
  }
  else {
    emit(this,3,0x2f,mt_slot);
    if (pos->X != 0) {
      emit(this,3,0x35,pos->X);
    }
    if (pos->Y != 0) {
      emit(this,3,0x36,pos->Y);
    }
  }
  if (report) {
    emit(this,0,0,0);
  }
  return;
}

Assistant:

void uInput::send_pos_absolute(const uInputCoordinate &pos, int32_t mt_slot, bool report) const {
	if (mt_slot == -1) {
		if (pos.X)
			emit(EV_ABS, ABS_X, pos.X);

		if (pos.Y)
			emit(EV_ABS, ABS_Y, pos.Y);

		if (pos.Z)
			emit(EV_ABS, ABS_Z, pos.Z);
	} else {
		emit(EV_ABS, ABS_MT_SLOT, mt_slot);

		if (pos.X)
			emit(EV_ABS, ABS_MT_POSITION_X, pos.X);

		if (pos.Y)
			emit(EV_ABS, ABS_MT_POSITION_Y, pos.Y);

	}

	if (report)
		emit(EV_SYN, SYN_REPORT, 0);
}